

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O0

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateDotLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  int iVar1;
  undefined8 uVar2;
  bool bVar3;
  string *psVar4;
  mapped_type_conflict1 *pmVar5;
  bool local_291;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  undefined1 local_190 [8];
  string err;
  _Self local_168;
  _Self local_160;
  _Self local_158;
  allocator local_149;
  string local_148;
  Result local_128;
  allocator local_f9;
  string local_f8;
  Result local_d8;
  undefined4 local_ac;
  Result local_a8;
  Result local_70;
  undefined1 local_48 [8];
  Result r;
  NeuralNetworkLayer *layer_local;
  NeuralNetworkSpecValidator *this_local;
  
  r.m_message.field_2._8_8_ = layer;
  Result::Result((Result *)local_48);
  validateInputCount(&local_70,(NeuralNetworkLayer *)r.m_message.field_2._8_8_,2,2);
  Result::operator=((Result *)local_48,&local_70);
  Result::~Result(&local_70);
  bVar3 = Result::good((Result *)local_48);
  if (bVar3) {
    validateOutputCount(&local_a8,(NeuralNetworkLayer *)r.m_message.field_2._8_8_,1,1);
    Result::operator=((Result *)local_48,&local_a8);
    Result::~Result(&local_a8);
  }
  bVar3 = Result::good((Result *)local_48);
  uVar2 = r.m_message.field_2._8_8_;
  if (!bVar3) {
    Result::Result(__return_storage_ptr__,(Result *)local_48);
    local_ac = 1;
    goto LAB_00a32143;
  }
  if ((this->ndArrayInterpretation & 1U) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_f8,"DotProduct",&local_f9);
    validateInputOutputRankEquality
              (&local_d8,(NeuralNetworkLayer *)uVar2,&local_f8,&this->blobNameToRank);
    Result::operator=((Result *)local_48,&local_d8);
    Result::~Result(&local_d8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_f9);
    bVar3 = Result::good((Result *)local_48);
    uVar2 = r.m_message.field_2._8_8_;
    if (!bVar3) {
      Result::Result(__return_storage_ptr__,(Result *)local_48);
      local_ac = 1;
      goto LAB_00a32143;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_148,"DotProduct",&local_149);
    validateRankCount(&local_128,(NeuralNetworkLayer *)uVar2,&local_148,3,-1,&this->blobNameToRank);
    Result::operator=((Result *)local_48,&local_128);
    Result::~Result(&local_128);
    std::__cxx11::string::~string((string *)&local_148);
    std::allocator<char>::~allocator((allocator<char> *)&local_149);
    bVar3 = Result::good((Result *)local_48);
    if (!bVar3) {
      Result::Result(__return_storage_ptr__,(Result *)local_48);
      local_ac = 1;
      goto LAB_00a32143;
    }
    psVar4 = Specification::NeuralNetworkLayer::input_abi_cxx11_
                       ((NeuralNetworkLayer *)r.m_message.field_2._8_8_,0);
    local_158._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
         ::find(&this->blobNameToRank,psVar4);
    local_160._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
         ::end(&this->blobNameToRank);
    bVar3 = std::operator!=(&local_158,&local_160);
    local_291 = false;
    if (bVar3) {
      psVar4 = Specification::NeuralNetworkLayer::input_abi_cxx11_
                         ((NeuralNetworkLayer *)r.m_message.field_2._8_8_,1);
      local_168._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::find(&this->blobNameToRank,psVar4);
      err.field_2._8_8_ =
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::end(&this->blobNameToRank);
      local_291 = std::operator!=(&local_168,(_Self *)((long)&err.field_2 + 8));
    }
    if (local_291 != false) {
      psVar4 = Specification::NeuralNetworkLayer::input_abi_cxx11_
                         ((NeuralNetworkLayer *)r.m_message.field_2._8_8_,0);
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::at(&this->blobNameToRank,psVar4);
      iVar1 = *pmVar5;
      psVar4 = Specification::NeuralNetworkLayer::input_abi_cxx11_
                         ((NeuralNetworkLayer *)r.m_message.field_2._8_8_,1);
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::at(&this->blobNameToRank,psVar4);
      if (iVar1 != *pmVar5) {
        std::__cxx11::string::string((string *)local_190);
        psVar4 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                           ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
        std::__cxx11::string::string((string *)&local_1f0,(string *)psVar4);
        std::operator+(&local_1d0,"Layer \'",&local_1f0);
        std::operator+(&local_1b0,&local_1d0,
                       "\' of type \'DotProduct\' expects equal ranks for its inputs, but they are not equal."
                      );
        std::__cxx11::string::operator=((string *)local_190,(string *)&local_1b0);
        std::__cxx11::string::~string((string *)&local_1b0);
        std::__cxx11::string::~string((string *)&local_1d0);
        std::__cxx11::string::~string((string *)&local_1f0);
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_190);
        local_ac = 1;
        std::__cxx11::string::~string((string *)local_190);
        goto LAB_00a32143;
      }
    }
  }
  Result::Result(__return_storage_ptr__,(Result *)local_48);
  local_ac = 1;
LAB_00a32143:
  Result::~Result((Result *)local_48);
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateDotLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    // 2 inputs, 1 output
    r = validateInputCount(layer, 2, 2);
    if (r.good()) {
        r = validateOutputCount(layer, 1, 1);
    }

    if (!r.good()){ return r;}
    if (ndArrayInterpretation) {
        r = validateInputOutputRankEquality(layer, "DotProduct", blobNameToRank);
        if (!r.good()) {return r;}
        r = validateRankCount(layer, "DotProduct", 3, -1, blobNameToRank);
        if (!r.good()) {return r;}

        if (blobNameToRank.find(layer.input(0)) != blobNameToRank.end() &&
            blobNameToRank.find(layer.input(1)) != blobNameToRank.end()) {
            if (blobNameToRank.at(layer.input(0)) != blobNameToRank.at(layer.input(1))) {
                std::string err;
                err = "Layer '" + std::string(layer.name()) + "' of type 'DotProduct' expects equal ranks for its inputs, but they are not equal.";
                return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
            }
        }
    }

    return r;
}